

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O0

bool_t wwIsRepW_fast(word *a,size_t n,word w)

{
  bool local_1d;
  bool_t ret;
  word w_local;
  size_t n_local;
  word *a_local;
  
  n_local = n;
  if (n == 0) {
    ret = (bool_t)(w == 0);
  }
  else {
    do {
      ret = (bool_t)(a[n_local - 1] == w);
      local_1d = ret != 0 && n_local - 1 != 0;
      n_local = n_local - 1;
    } while (local_1d);
  }
  return ret;
}

Assistant:

bool_t FAST(wwIsRepW)(const word a[], size_t n, register word w)
{
	register bool_t ret;
	ASSERT(wwIsValid(a, n));
	if (n == 0)
		ret = (w == 0);
	else
	{
		do
			ret = (a[--n] == w);
		while (ret && n);
	}
	w = 0;
	return ret;
}